

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O0

void __thiscall
customUnits_uniquenesspersecond_Test::TestBody(customUnits_uniquenesspersecond_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Message *pMVar3;
  char *in_R9;
  string local_290;
  AssertHelper local_270;
  Message local_268;
  precise_unit local_260;
  bool local_249;
  undefined1 local_248 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_218;
  Message local_210;
  bool local_201;
  undefined1 local_200 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1d0;
  Message local_1c8;
  bool local_1b9;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_188;
  Message local_180;
  bool local_171;
  undefined1 local_170 [8];
  AssertionResult gtest_ar__2;
  precise_unit cunit2adj;
  precise_unit cunit2;
  undefined1 local_138 [6];
  uint16_t jj;
  AssertHelper local_118;
  Message local_110;
  unit_data local_108;
  bool local_101;
  undefined1 local_100 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_d0;
  Message local_c8;
  unit_data local_c0;
  bool local_b9;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_;
  Message local_a0;
  precise_unit local_98;
  unit_data local_88;
  int local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Message local_68 [3];
  unit_data local_50;
  int local_4c;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  precise_unit cunit1adj;
  precise_unit cunit1;
  uint16_t ii;
  customUnits_uniquenesspersecond_Test *this_local;
  
  for (cunit1.commodity_._2_2_ = 0; cunit1.commodity_._2_2_ < 0x400;
      cunit1.commodity_._2_2_ = cunit1.commodity_._2_2_ + 1) {
    join_0x00000000_0x00001200_ = units::precise::generate_custom_unit(cunit1.commodity_._2_2_);
    join_0x00000000_0x00001200_ =
         units::precise_unit::operator/
                   ((precise_unit *)&cunit1adj.base_units_,(precise_unit *)units::precise::s);
    local_50 = units::precise_unit::base_units((precise_unit *)&gtest_ar.message_);
    local_4c = units::precise::custom::custom_unit_number(&local_50);
    testing::internal::EqHelper::Compare<int,_unsigned_short,_nullptr>
              ((EqHelper *)local_48,"precise::custom::custom_unit_number(cunit1adj.base_units())",
               "ii",&local_4c,(unsigned_short *)((long)&cunit1.commodity_ + 2));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
    if (!bVar1) {
      testing::Message::Message(local_68);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_48);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x42e,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(local_68);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
    local_98 = units::precise_unit::inv((precise_unit *)&gtest_ar.message_);
    local_88 = units::precise_unit::base_units(&local_98);
    local_84 = units::precise::custom::custom_unit_number(&local_88);
    testing::internal::EqHelper::Compare<int,_unsigned_short,_nullptr>
              ((EqHelper *)local_80,
               "precise::custom::custom_unit_number(cunit1adj.inv().base_units())","ii",&local_84,
               (unsigned_short *)((long)&cunit1.commodity_ + 2));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
    if (!bVar1) {
      testing::Message::Message(&local_a0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x431,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      testing::Message::~Message(&local_a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
    local_c0 = units::precise_unit::base_units((precise_unit *)&cunit1adj.base_units_);
    local_b9 = units::precise::custom::is_custom_unit(&local_c0);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_b8,&local_b9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
    if (!bVar1) {
      testing::Message::Message(&local_c8);
      pMVar3 = testing::Message::operator<<
                         (&local_c8,(char (*) [36])"Error with custom unit/s detection ");
      pMVar3 = testing::Message::operator<<(pMVar3,(unsigned_short *)((long)&cunit1.commodity_ + 2))
      ;
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__1.message_,(internal *)local_b8,
                 (AssertionResult *)"precise::custom::is_custom_unit(cunit1.base_units())","false",
                 "true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x432,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d0,pMVar3);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
    local_108 = units::precise_unit::base_units((precise_unit *)&gtest_ar.message_);
    local_101 = units::precise::custom::is_custom_unit(&local_108);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_100,&local_101,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      pMVar3 = testing::Message::operator<<
                         (&local_110,(char (*) [47])"Error with custom unit/s detection of inverse "
                         );
      pMVar3 = testing::Message::operator<<(pMVar3,(unsigned_short *)((long)&cunit1.commodity_ + 2))
      ;
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_138,(internal *)local_100,
                 (AssertionResult *)"precise::custom::is_custom_unit(cunit1adj.base_units())",
                 "false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x434,pcVar2);
      testing::internal::AssertHelper::operator=(&local_118,pMVar3);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      std::__cxx11::string::~string((string *)local_138);
      testing::Message::~Message(&local_110);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
    for (cunit2.commodity_._2_2_ = 0; cunit2.commodity_._2_2_ < 0x400;
        cunit2.commodity_._2_2_ = cunit2.commodity_._2_2_ + 1) {
      if (cunit1.commodity_._2_2_ != cunit2.commodity_._2_2_) {
        join_0x00000000_0x00001200_ = units::precise::generate_custom_unit(cunit2.commodity_._2_2_);
        join_0x00000000_0x00001200_ =
             units::precise_unit::operator/
                       ((precise_unit *)&cunit2adj.base_units_,(precise_unit *)units::precise::s);
        local_171 = units::precise_unit::operator==
                              ((precise_unit *)&cunit1adj.base_units_,
                               (precise_unit *)&gtest_ar__2.message_);
        local_171 = !local_171;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_170,&local_171,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
        if (!bVar1) {
          testing::Message::Message(&local_180);
          pMVar3 = testing::Message::operator<<
                             (&local_180,
                              (char (*) [49])"Error with false per sec comparison 1 inv index ");
          pMVar3 = testing::Message::operator<<
                             (pMVar3,(unsigned_short *)((long)&cunit1.commodity_ + 2));
          pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [2])",");
          pMVar3 = testing::Message::operator<<
                             (pMVar3,(unsigned_short *)((long)&cunit2.commodity_ + 2));
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__3.message_,(internal *)local_170,
                     (AssertionResult *)"cunit1 == cunit2adj","true","false",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_188,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                     ,0x43c,pcVar2);
          testing::internal::AssertHelper::operator=(&local_188,pMVar3);
          testing::internal::AssertHelper::~AssertHelper(&local_188);
          std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
          testing::Message::~Message(&local_180);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
        local_1b9 = units::precise_unit::operator==
                              ((precise_unit *)&gtest_ar.message_,
                               (precise_unit *)&cunit2adj.base_units_);
        local_1b9 = !local_1b9;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_1b8,&local_1b9,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
        if (!bVar1) {
          testing::Message::Message(&local_1c8);
          pMVar3 = testing::Message::operator<<
                             (&local_1c8,
                              (char (*) [45])"Error with false per sec comparison 2 index ");
          pMVar3 = testing::Message::operator<<
                             (pMVar3,(unsigned_short *)((long)&cunit1.commodity_ + 2));
          pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [2])",");
          pMVar3 = testing::Message::operator<<
                             (pMVar3,(unsigned_short *)((long)&cunit2.commodity_ + 2));
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_1b8,
                     (AssertionResult *)"cunit1adj == cunit2","true","false",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                     ,0x43f,pcVar2);
          testing::internal::AssertHelper::operator=(&local_1d0,pMVar3);
          testing::internal::AssertHelper::~AssertHelper(&local_1d0);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_1c8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
        local_201 = units::precise_unit::operator==
                              ((precise_unit *)&gtest_ar.message_,
                               (precise_unit *)&gtest_ar__2.message_);
        local_201 = !local_201;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_200,&local_201,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
        if (!bVar1) {
          testing::Message::Message(&local_210);
          pMVar3 = testing::Message::operator<<
                             (&local_210,
                              (char (*) [53])"Error with false per sec comparison 2 per sec index ")
          ;
          pMVar3 = testing::Message::operator<<
                             (pMVar3,(unsigned_short *)((long)&cunit1.commodity_ + 2));
          pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [2])",");
          pMVar3 = testing::Message::operator<<
                             (pMVar3,(unsigned_short *)((long)&cunit2.commodity_ + 2));
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__5.message_,(internal *)local_200,
                     (AssertionResult *)"cunit1adj == cunit2adj","true","false",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_218,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                     ,0x442,pcVar2);
          testing::internal::AssertHelper::operator=(&local_218,pMVar3);
          testing::internal::AssertHelper::~AssertHelper(&local_218);
          std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
          testing::Message::~Message(&local_210);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
      }
    }
    local_260 = units::precise_unit::operator*
                          ((precise_unit *)&gtest_ar.message_,(precise_unit *)units::precise::s);
    local_249 = units::precise_unit::operator==(&local_260,(precise_unit *)&cunit1adj.base_units_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_248,&local_249,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
    if (!bVar1) {
      testing::Message::Message(&local_268);
      pMVar3 = testing::Message::operator<<
                         (&local_268,(char (*) [33])"Error with true per sec multiply");
      pMVar3 = testing::Message::operator<<(pMVar3,(unsigned_short *)((long)&cunit1.commodity_ + 2))
      ;
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_290,(internal *)local_248,
                 (AssertionResult *)"cunit1adj * precise::s == cunit1","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_270,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x446,pcVar2);
      testing::internal::AssertHelper::operator=(&local_270,pMVar3);
      testing::internal::AssertHelper::~AssertHelper(&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      testing::Message::~Message(&local_268);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  }
  return;
}

Assistant:

TEST(customUnits, uniquenesspersecond)
{
    for (std::uint16_t ii = 0; ii < 1024; ++ii) {
        auto cunit1 = precise::generate_custom_unit(ii);
        auto cunit1adj = cunit1 / precise::s;
        EXPECT_EQ(
            precise::custom::custom_unit_number(cunit1adj.base_units()), ii);
        EXPECT_EQ(
            precise::custom::custom_unit_number(cunit1adj.inv().base_units()),
            ii);
        EXPECT_TRUE(precise::custom::is_custom_unit(cunit1.base_units()))
            << "Error with custom unit/s detection " << ii;
        EXPECT_TRUE(precise::custom::is_custom_unit(cunit1adj.base_units()))
            << "Error with custom unit/s detection of inverse " << ii;
        for (std::uint16_t jj = 0; jj < 1024; ++jj) {
            if (ii == jj) {
                continue;
            }
            auto cunit2 = precise::generate_custom_unit(jj);
            auto cunit2adj = cunit2 / precise::s;
            EXPECT_FALSE(cunit1 == cunit2adj)
                << "Error with false per sec comparison 1 inv index " << ii
                << "," << jj;
            EXPECT_FALSE(cunit1adj == cunit2)
                << "Error with false per sec comparison 2 index " << ii << ","
                << jj;
            EXPECT_FALSE(cunit1adj == cunit2adj)
                << "Error with false per sec comparison 2 per sec index " << ii
                << "," << jj;
        }
        EXPECT_TRUE(cunit1adj * precise::s == cunit1)
            << "Error with true per sec multiply" << ii;
    }
}